

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_merge_sort_tree.cpp
# Opt level: O0

void __thiscall
duckdb::WindowMergeSortTreeLocalState::BuildLeaves(WindowMergeSortTreeLocalState *this)

{
  bool bVar1;
  DataChunk *this_00;
  idx_t iVar2;
  long in_RDI;
  unsigned_long *data_1;
  Elements *sorted_1;
  uint *data;
  Elements *sorted;
  value_type *indices;
  idx_t count;
  idx_t row_idx;
  PayloadScanner scanner;
  GlobalSortState *global_sort;
  DataChunk *in_stack_ffffffffffffff18;
  PayloadScanner *in_stack_ffffffffffffff20;
  pointer *in_stack_ffffffffffffff28;
  PayloadScanner *in_stack_ffffffffffffff30;
  
  unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::operator*
            ((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
              *)in_stack_ffffffffffffff20);
  bVar1 = ::std::
          vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
          ::empty((vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                   *)in_stack_ffffffffffffff30);
  if (!bVar1) {
    PayloadScanner::PayloadScanner
              ((PayloadScanner *)sorted,(GlobalSortState *)data,(idx_t)sorted_1,data_1._7_1_);
    this_00 = (DataChunk *)
              vector<unsigned_long,_true>::operator[]
                        ((vector<unsigned_long,_true> *)in_stack_ffffffffffffff20,
                         (size_type)in_stack_ffffffffffffff18);
    while( true ) {
      DataChunk::Reset(this_00);
      PayloadScanner::Scan(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      iVar2 = DataChunk::size((DataChunk *)(in_RDI + 0xa0));
      if (iVar2 == 0) break;
      vector<duckdb::Vector,_true>::operator[]
                ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff20,
                 (size_type)in_stack_ffffffffffffff18);
      bVar1 = ::std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>_>
                          *)0x1a3e45d);
      if (bVar1) {
        unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
        ::operator->((unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
                      *)in_stack_ffffffffffffff20);
        MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::LowestLevel
                  ((MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *
                   )0x1a3e48c);
        FlatVector::GetData<unsigned_int>((Vector *)0x1a3e4ad);
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1a3e4ec);
        ::std::copy<unsigned_int*,unsigned_int*>
                  ((uint *)in_stack_ffffffffffffff30,(uint *)in_stack_ffffffffffffff28,
                   (uint *)in_stack_ffffffffffffff20);
      }
      else {
        unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
        ::operator->((unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
                      *)in_stack_ffffffffffffff20);
        MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::
        LowestLevel((MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
                     *)0x1a3e534);
        in_stack_ffffffffffffff20 =
             (PayloadScanner *)FlatVector::GetData<unsigned_long>((Vector *)0x1a3e555);
        in_stack_ffffffffffffff28 =
             &(((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &in_stack_ffffffffffffff20->rows)->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start + iVar2;
        in_stack_ffffffffffffff30 = in_stack_ffffffffffffff20;
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1a3e58e);
        ::std::copy<unsigned_long*,unsigned_long*>
                  ((unsigned_long *)in_stack_ffffffffffffff30,
                   (unsigned_long *)in_stack_ffffffffffffff28,
                   (unsigned_long *)in_stack_ffffffffffffff20);
      }
    }
    PayloadScanner::~PayloadScanner(in_stack_ffffffffffffff20);
  }
  return;
}

Assistant:

void WindowMergeSortTreeLocalState::BuildLeaves() {
	auto &global_sort = *window_tree.global_sort;
	if (global_sort.sorted_blocks.empty()) {
		return;
	}

	PayloadScanner scanner(global_sort, build_task);
	idx_t row_idx = window_tree.block_starts[build_task];
	for (;;) {
		payload_chunk.Reset();
		scanner.Scan(payload_chunk);
		const auto count = payload_chunk.size();
		if (count == 0) {
			break;
		}
		auto &indices = payload_chunk.data[0];
		if (window_tree.mst32) {
			auto &sorted = window_tree.mst32->LowestLevel();
			auto data = FlatVector::GetData<uint32_t>(indices);
			std::copy(data, data + count, sorted.data() + row_idx);
		} else {
			auto &sorted = window_tree.mst64->LowestLevel();
			auto data = FlatVector::GetData<uint64_t>(indices);
			std::copy(data, data + count, sorted.data() + row_idx);
		}
		row_idx += count;
	}
}